

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

void __thiscall FixedVssInstance::enforceBoundaryConstraints(FixedVssInstance *this)

{
  expr_vector *this_00;
  bool bVar1;
  uint uVar2;
  optimize *this_01;
  int i;
  ast *this_02;
  ulong uVar3;
  ast local_50;
  ast local_40;
  
  this_00 = &(this->super_Instance).borderVars;
  this_01 = &(this->super_Instance).solver;
  uVar3 = 0;
  while( true ) {
    uVar2 = z3::ast_vector_tpl<z3::expr>::size(this_00);
    if (uVar2 <= uVar3) break;
    bVar1 = Graph::isBoundary(&(this->super_Instance).graph,(int)uVar3);
    i = (int)this_00;
    if (bVar1) {
      z3::ast_vector_tpl<z3::expr>::operator[]((ast_vector_tpl<z3::expr> *)&local_50,i);
      z3::optimize::add(this_01,(expr *)&local_50);
      this_02 = &local_50;
    }
    else {
      z3::ast_vector_tpl<z3::expr>::operator[]((ast_vector_tpl<z3::expr> *)&local_40,i);
      z3::operator!((z3 *)&local_50,(expr *)&local_40);
      z3::optimize::add(this_01,(expr *)&local_50);
      z3::ast::~ast(&local_50);
      this_02 = &local_40;
    }
    z3::ast::~ast(this_02);
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void FixedVssInstance::enforceBoundaryConstraints() {
  for (size_t vertex = 0; vertex < borderVars.size(); vertex++) {

    if (graph.isBoundary(vertex)) {
      solver.add(borderVars[vertex]);
    } else {
      solver.add(!borderVars[vertex]);
    }
  }
}